

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# state.h
# Opt level: O2

void __thiscall
jsonnet::internal::anon_unknown_0::HeapClosure::HeapClosure
          (HeapClosure *this,BindingFrame *up_values,HeapObject *self,uint offset,Params *params,
          AST *body,string *builtin_name)

{
  pointer pPVar1;
  AST *pAVar2;
  Param *__cur;
  pointer pPVar3;
  pointer pPVar4;
  long lVar5;
  
  (this->super_HeapEntity).type = CLOSURE;
  (this->super_HeapEntity)._vptr_HeapEntity = (_func_int **)&PTR__HeapClosure_002327a8;
  std::
  map<const_jsonnet::internal::Identifier_*,_jsonnet::internal::(anonymous_namespace)::HeapThunk_*,_std::less<const_jsonnet::internal::Identifier_*>,_std::allocator<std::pair<const_jsonnet::internal::Identifier_*const,_jsonnet::internal::(anonymous_namespace)::HeapThunk_*>_>_>
  ::map(&this->upValues,up_values);
  this->self = self;
  this->offset = offset;
  lVar5 = (long)(params->
                super__Vector_base<jsonnet::internal::(anonymous_namespace)::HeapClosure::Param,_std::allocator<jsonnet::internal::(anonymous_namespace)::HeapClosure::Param>_>
                )._M_impl.super__Vector_impl_data._M_finish -
          (long)(params->
                super__Vector_base<jsonnet::internal::(anonymous_namespace)::HeapClosure::Param,_std::allocator<jsonnet::internal::(anonymous_namespace)::HeapClosure::Param>_>
                )._M_impl.super__Vector_impl_data._M_start;
  (this->params).
  super__Vector_base<jsonnet::internal::(anonymous_namespace)::HeapClosure::Param,_std::allocator<jsonnet::internal::(anonymous_namespace)::HeapClosure::Param>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->params).
  super__Vector_base<jsonnet::internal::(anonymous_namespace)::HeapClosure::Param,_std::allocator<jsonnet::internal::(anonymous_namespace)::HeapClosure::Param>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->params).
  super__Vector_base<jsonnet::internal::(anonymous_namespace)::HeapClosure::Param,_std::allocator<jsonnet::internal::(anonymous_namespace)::HeapClosure::Param>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pPVar3 = std::
           _Vector_base<jsonnet::internal::(anonymous_namespace)::HeapClosure::Param,_std::allocator<jsonnet::internal::(anonymous_namespace)::HeapClosure::Param>_>
           ::_M_allocate((_Vector_base<jsonnet::internal::(anonymous_namespace)::HeapClosure::Param,_std::allocator<jsonnet::internal::(anonymous_namespace)::HeapClosure::Param>_>
                          *)(lVar5 >> 4),(size_t)up_values);
  (this->params).
  super__Vector_base<jsonnet::internal::(anonymous_namespace)::HeapClosure::Param,_std::allocator<jsonnet::internal::(anonymous_namespace)::HeapClosure::Param>_>
  ._M_impl.super__Vector_impl_data._M_start = pPVar3;
  (this->params).
  super__Vector_base<jsonnet::internal::(anonymous_namespace)::HeapClosure::Param,_std::allocator<jsonnet::internal::(anonymous_namespace)::HeapClosure::Param>_>
  ._M_impl.super__Vector_impl_data._M_finish = pPVar3;
  (this->params).
  super__Vector_base<jsonnet::internal::(anonymous_namespace)::HeapClosure::Param,_std::allocator<jsonnet::internal::(anonymous_namespace)::HeapClosure::Param>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)(lVar5 + (long)pPVar3);
  pPVar1 = (params->
           super__Vector_base<jsonnet::internal::(anonymous_namespace)::HeapClosure::Param,_std::allocator<jsonnet::internal::(anonymous_namespace)::HeapClosure::Param>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  for (pPVar4 = (params->
                super__Vector_base<jsonnet::internal::(anonymous_namespace)::HeapClosure::Param,_std::allocator<jsonnet::internal::(anonymous_namespace)::HeapClosure::Param>_>
                )._M_impl.super__Vector_impl_data._M_start; pPVar4 != pPVar1; pPVar4 = pPVar4 + 1) {
    pAVar2 = pPVar4->def;
    pPVar3->id = pPVar4->id;
    pPVar3->def = pAVar2;
    pPVar3 = pPVar3 + 1;
  }
  (this->params).
  super__Vector_base<jsonnet::internal::(anonymous_namespace)::HeapClosure::Param,_std::allocator<jsonnet::internal::(anonymous_namespace)::HeapClosure::Param>_>
  ._M_impl.super__Vector_impl_data._M_finish = pPVar3;
  this->body = body;
  std::__cxx11::string::string((string *)&this->builtinName,(string *)builtin_name);
  return;
}

Assistant:

HeapClosure(const BindingFrame &up_values, HeapObject *self, unsigned offset,
                const Params &params, const AST *body, const std::string &builtin_name)
        : HeapEntity(CLOSURE),
          upValues(up_values),
          self(self),
          offset(offset),
          params(params),
          body(body),
          builtinName(builtin_name)
    {
    }